

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 jsonUnescapeOneChar(char *z,u32 n,u32 *piOut)

{
  byte bVar1;
  u8 uVar2;
  int iVar3;
  u32 uVar4;
  u32 uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  iVar9 = 0;
LAB_00194eb7:
  if (n < 2) {
LAB_0019509a:
    *piOut = 0x99999;
LAB_001950c0:
    return n + iVar9;
  }
  bVar1 = ((u8 *)z)[1];
  uVar8 = (ulong)bVar1;
  uVar7 = (uint)bVar1;
  if (uVar8 < 0x31) {
    if ((0x2400UL >> (uVar8 & 0x3f) & 1) != 0) goto LAB_00194ef1;
    if ((0x808400000000U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 != 0x30) goto LAB_00194ee5;
      *piOut = 0;
    }
    else {
LAB_00194fdf:
      *piOut = uVar7;
    }
  }
  else {
LAB_00194ee5:
    if (bVar1 == 0xe2) {
LAB_00194ef1:
      uVar7 = 0;
      while( true ) {
        uVar6 = uVar7;
        if (((n <= uVar6 + 1) || (((u8 *)z)[uVar6] != '\\')) ||
           (uVar2 = ((u8 *)z)[uVar6 + 1], uVar2 == 0xe2)) break;
        if (uVar2 == '\r') {
          uVar7 = uVar6 + 2;
          if ((uVar7 < n) && (((u8 *)z)[uVar7] == '\n')) {
            uVar7 = uVar6 + 3;
          }
        }
        else {
          if (uVar2 != '\n') break;
          uVar7 = uVar6 + 2;
        }
      }
      if (uVar6 == 0) goto LAB_0019509a;
      uVar7 = n - uVar6;
      if (uVar7 == 0) {
        *piOut = 0;
        goto LAB_001950c0;
      }
      if (((u8 *)z)[uVar6] != '\\') {
        iVar3 = sqlite3Utf8ReadLimited((u8 *)z + uVar6,uVar7,piOut);
        n = iVar3 + uVar6;
        goto LAB_001950c0;
      }
      iVar9 = uVar6 + iVar9;
      z = (char *)((u8 *)z + uVar6);
      n = uVar7;
      goto LAB_00194eb7;
    }
    switch(bVar1) {
    case 0x6e:
      *piOut = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x77:
switchD_00194fb0_caseD_6f:
      *piOut = 0x99999;
      break;
    case 0x72:
      *piOut = 0xd;
      break;
    case 0x74:
      *piOut = 9;
      break;
    case 0x75:
      if (5 < n) {
        uVar4 = jsonHexToInt4((char *)((u8 *)z + 2));
        if (((n < 0xc) || ((uVar4 & 0xfc00) != 0xd800)) ||
           ((((u8 *)z)[6] != '\\' ||
            ((((u8 *)z)[7] != 'u' ||
             (uVar5 = jsonHexToInt4((char *)((u8 *)z + 8)), (uVar5 & 0xfc00) != 0xdc00)))))) {
          *piOut = uVar4;
          n = 6;
        }
        else {
          *piOut = (uVar5 & 0x3ff) + (uVar4 & 0x3ff) * 0x400 + 0x10000;
          n = 0xc;
        }
        goto LAB_001950c0;
      }
      goto LAB_0019509a;
    case 0x76:
      *piOut = 0xb;
      break;
    case 0x78:
      if (3 < n) {
        *piOut = (uint)(byte)(((char)(((u8 *)z)[3] * '\x02') >> 7 & 9U) + ((u8 *)z)[3] & 0xf |
                             (((char)(((u8 *)z)[2] * '\x02') >> 7 & 9U) + ((u8 *)z)[2]) * '\x10');
        n = 4;
        goto LAB_001950c0;
      }
      goto LAB_0019509a;
    default:
      if (bVar1 == 0x5c) goto LAB_00194fdf;
      if (uVar7 == 0x62) {
        *piOut = 8;
      }
      else {
        if (uVar7 != 0x66) goto switchD_00194fb0_caseD_6f;
        *piOut = 0xc;
      }
    }
  }
  n = 2;
  goto LAB_001950c0;
}

Assistant:

static u32 jsonUnescapeOneChar(const char *z, u32 n, u32 *piOut){
  assert( n>0 );
  assert( z[0]=='\\' );
  if( n<2 ){
    *piOut = JSON_INVALID_CHAR;
    return n;
  }
  switch( (u8)z[1] ){
    case 'u': {
      u32 v, vlo;
      if( n<6 ){
        *piOut = JSON_INVALID_CHAR;
        return n;
      }
      v = jsonHexToInt4(&z[2]);
      if( (v & 0xfc00)==0xd800
       && n>=12
       && z[6]=='\\'
       && z[7]=='u'
       && ((vlo = jsonHexToInt4(&z[8]))&0xfc00)==0xdc00
      ){
        *piOut = ((v&0x3ff)<<10) + (vlo&0x3ff) + 0x10000;
        return 12;
      }else{
        *piOut = v;
        return 6;
      }
    }
    case 'b': {   *piOut = '\b';  return 2; }
    case 'f': {   *piOut = '\f';  return 2; }
    case 'n': {   *piOut = '\n';  return 2; }
    case 'r': {   *piOut = '\r';  return 2; }
    case 't': {   *piOut = '\t';  return 2; }
    case 'v': {   *piOut = '\v';  return 2; }
    case '0': {   *piOut = 0;     return 2; }
    case '\'':
    case '"':
    case '/':
    case '\\':{   *piOut = z[1];  return 2; }
    case 'x': {
      if( n<4 ){
        *piOut = JSON_INVALID_CHAR;
        return n;
      }
      *piOut = (jsonHexToInt(z[2])<<4) | jsonHexToInt(z[3]);
      return 4;
    }
    case 0xe2:
    case '\r':
    case '\n': {
      u32 nSkip = jsonBytesToBypass(z, n);
      if( nSkip==0 ){
        *piOut = JSON_INVALID_CHAR;
        return n;
      }else if( nSkip==n ){
        *piOut = 0;
        return n;
      }else if( z[nSkip]=='\\' ){
        return nSkip + jsonUnescapeOneChar(&z[nSkip], n-nSkip, piOut);
      }else{
        int sz = sqlite3Utf8ReadLimited((u8*)&z[nSkip], n-nSkip, piOut);
        return nSkip + sz;
      }
    }
    default: {
      *piOut = JSON_INVALID_CHAR;
      return 2;
    }
  }
}